

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::remap_render_pass_handle
          (Impl *this,VkRenderPass render_pass,VkRenderPass *out_render_pass)

{
  bool bVar1;
  LogLevel LVar2;
  pointer pvVar3;
  VkRenderPass_T *pVVar4;
  _Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false> local_38;
  _Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false> local_30;
  const_iterator itr;
  VkRenderPass *out_render_pass_local;
  VkRenderPass render_pass_local;
  Impl *this_local;
  
  if (render_pass == (VkRenderPass)0x0) {
    *out_render_pass = (VkRenderPass)0x0;
    this_local._7_1_ = true;
  }
  else {
    itr.super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false>._M_cur =
         (_Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false>)
         (_Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false>)
         out_render_pass;
    out_render_pass_local = (VkRenderPass *)render_pass;
    render_pass_local = (VkRenderPass)this;
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<VkRenderPass_T_*,_unsigned_long,_std::hash<VkRenderPass_T_*>,_std::equal_to<VkRenderPass_T_*>,_std::allocator<std::pair<VkRenderPass_T_*const,_unsigned_long>_>_>
         ::find(&this->render_pass_to_hash,(key_type *)&out_render_pass_local);
    local_38._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<VkRenderPass_T*,unsigned_long,std::hash<VkRenderPass_T*>,std::equal_to<VkRenderPass_T*>,std::allocator<std::pair<VkRenderPass_T*const,unsigned_long>>>>
                   (&this->render_pass_to_hash);
    bVar1 = std::__detail::operator==(&local_30,&local_38);
    if (bVar1) {
      LVar2 = get_thread_log_level();
      if (((int)LVar2 < 2) &&
         (bVar1 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Cannot find render pass in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
                            ), !bVar1)) {
        fprintf(_stderr,
                "Fossilize WARN: Cannot find render pass in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
               );
      }
      this_local._7_1_ = false;
    }
    else {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false,_false>::
               operator->((_Node_const_iterator<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false,_false>
                           *)&local_30);
      pVVar4 = api_object_cast<VkRenderPass_T*,unsigned_long>(pvVar3->second);
      *(VkRenderPass_T **)
       itr.super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false>._M_cur
           = pVVar4;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::remap_render_pass_handle(VkRenderPass render_pass, VkRenderPass *out_render_pass) const
{
	if (render_pass == VK_NULL_HANDLE)
	{
		// Dynamic rendering.
		*out_render_pass = VK_NULL_HANDLE;
		return true;
	}

	auto itr = render_pass_to_hash.find(render_pass);
	if (itr == end(render_pass_to_hash))
	{
		LOGW_LEVEL("Cannot find render pass in hashmap.\n"
		           "Object has either not been recorded, or it was not supported by Fossilize.\n");
		return false;
	}
	else
	{
		*out_render_pass = api_object_cast<VkRenderPass>(uint64_t(itr->second));
		return true;
	}
}